

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O3

void __thiscall ltc::set_store_data(ltc *this,ltc_store_data *data)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  mat<3,_3,_float,_(glm::precision)0> Inverse;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_38;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  
  fVar1 = data->fresnel_term;
  this->_amplitude = data->distribution_norm;
  this->_fresnel = fVar1;
  fVar1 = (data->matrix_parameters)._M_elems[0];
  fVar2 = (data->matrix_parameters)._M_elems[1];
  fVar3 = (data->matrix_parameters)._M_elems[2];
  fVar4 = (data->matrix_parameters)._M_elems[3];
  fVar5 = (data->matrix_parameters)._M_elems[4];
  fVar6 = fVar5 * 0.0 + fVar2 * -0.0;
  fVar7 = 0.0 - fVar2 * fVar3;
  fStack_1c = 1.0 / (fVar4 * fVar7 + fVar1 * fVar3 * fVar5 + fVar6 * -0.0);
  local_18 = fVar1 * fVar3 * fStack_1c;
  local_38.field_0.x = fVar3 * fVar5 * fStack_1c;
  local_38.field_0.y = -fVar6 * fStack_1c;
  local_38.field_0.z = fVar7 * fStack_1c;
  fStack_2c = -(fVar5 * 0.0 + fVar4 * -0.0) * fStack_1c;
  local_28 = (fVar5 * fVar1 - fVar2 * fVar4) * fStack_1c;
  fStack_24 = -(fVar1 * 0.0 + fVar2 * -0.0) * fStack_1c;
  fStack_20 = (0.0 - fVar3 * fVar4) * fStack_1c;
  fStack_1c = -(fVar4 * -0.0 + fVar1 * 0.0) * fStack_1c;
  set_ltc_matrix(this,(mat3 *)&local_38.field_0);
  *(undefined8 *)&(this->_base_frame).value[0].field_0 = 0x3f800000;
  *(undefined8 *)((long)&(this->_base_frame).value[0].field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->_base_frame).value[1].field_0 + 4) = 0x3f800000;
  *(undefined8 *)&(this->_base_frame).value[2].field_0 = 0;
  (this->_base_frame).value[2].field_0.field_0.z = 1.0;
  return;
}

Assistant:

void ltc::set_store_data(const ltc_store_data &data)
{
  _amplitude = data.distribution_norm;
  _fresnel = data.fresnel_term;

  // TODO: Inverse may cause loss of data. It is done at least once during fitting process.
  const auto &mtx = data.matrix_parameters;
  set_ltc_matrix(glm::inverse(glm::mat3{
    {mtx[0], 0.0f,   mtx[1]},
    {0.0f,   mtx[2], 0.0f},
    {mtx[3], 0.0f,   mtx[4]}
  }));

  _base_frame = glm::mat4{};
}